

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O2

void __thiscall
sentencepiece::unigram::Model::BuildTrie
          (Model *this,
          vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          *pieces)

{
  DoubleArrayImpl<void,_void,_int,_void> *pDVar1;
  pointer ppVar2;
  pointer prVar3;
  pointer ppcVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *p;
  pointer ppVar9;
  string_view str;
  string_view str_00;
  string_view str_01;
  Status local_70;
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  results;
  vector<const_char_*,_std::allocator<const_char_*>_> key;
  vector<int,_std::allocator<int>_> value;
  
  (*(this->super_ModelInterface)._vptr_ModelInterface[2])(&key,this);
  ppcVar4 = key.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  util::Status::~Status((Status *)&key);
  if (ppcVar4 == (pointer)0x0) {
    if ((pieces->
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (pieces->
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      str_00._M_str = (char *)0x15;
      str_00._M_len = (size_t)&key;
      util::InternalError(str_00);
      util::Status::operator=(&(this->super_ModelInterface).status_,(Status *)&key);
      util::Status::~Status((Status *)&key);
    }
    else {
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&key,((long)(pieces->
                             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pieces->
                            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18,
                 (allocator_type *)&value);
      std::vector<int,_std::allocator<int>_>::vector
                (&value,((long)(pieces->
                               super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pieces->
                              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x18,
                 (allocator_type *)&results);
      lVar7 = 0;
      for (uVar8 = 0;
          ppVar9 = (pieces->
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar8 < (ulong)(((long)(pieces->
                                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9) / 0x18)
          ; uVar8 = uVar8 + 1) {
        key.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = *(char **)((long)&(ppVar9->first)._M_str + lVar7);
        value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar8] = *(int *)((long)&((pieces->
                                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->second + lVar7);
        lVar7 = lVar7 + 0x18;
      }
      std::make_unique<Darts::DoubleArrayImpl<void,void,int,void>>();
      prVar3 = results.
               super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
               ._M_impl.super__Vector_impl_data._M_start;
      results.
      super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pDVar1 = (this->trie_)._M_t.
               super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
               .super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>.
               _M_head_impl;
      (this->trie_)._M_t.
      super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
      .super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>._M_head_impl =
           (DoubleArrayImpl<void,_void,_int,_void> *)prVar3;
      if (pDVar1 != (DoubleArrayImpl<void,_void,_int,_void> *)0x0) {
        (*pDVar1->_vptr_DoubleArrayImpl[1])();
        if (results.
            super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(*(long *)results.
                                super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                                ._M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
      iVar5 = Darts::DoubleArrayImpl<void,_void,_int,_void>::build
                        ((this->trie_)._M_t.
                         super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                         .
                         super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>
                         ._M_head_impl,
                         (long)key.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)key.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3,
                         key.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                         .super__Vector_impl_data._M_start,(size_t *)0x0,
                         value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,(progress_func_type)0x0);
      if (iVar5 == 0) {
        std::
        vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
        ::vector(&results,0x400,(allocator_type *)&local_70);
        this->trie_results_size_ = 0;
        ppVar2 = (pieces->
                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar9 = (pieces->
                      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2;
            ppVar9 = ppVar9 + 1) {
          sVar6 = Darts::DoubleArrayImpl<void,void,int,void>::
                  commonPrefixSearch<Darts::DoubleArrayImpl<void,void,int,void>::result_pair_type>
                            ((DoubleArrayImpl<void,void,int,void> *)
                             (this->trie_)._M_t.
                             super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                             .
                             super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>
                             ._M_head_impl,(ppVar9->first)._M_str,
                             results.
                             super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (long)results.
                                   super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)results.
                                   super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4,
                             (ppVar9->first)._M_len,0);
          iVar5 = (int)sVar6;
          if ((int)sVar6 < this->trie_results_size_) {
            iVar5 = this->trie_results_size_;
          }
          this->trie_results_size_ = iVar5;
        }
        std::
        _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear(&(this->super_ModelInterface).pieces_._M_h);
        if (this->trie_results_size_ == 0) {
          str_01._M_str = (char *)0x1e;
          str_01._M_len = (size_t)&local_70;
          util::InternalError(str_01);
          util::Status::operator=(&(this->super_ModelInterface).status_,&local_70);
          util::Status::~Status(&local_70);
        }
        std::
        _Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
        ::~_Vector_base(&results.
                         super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                       );
      }
      else {
        str._M_str = (char *)0x1a;
        str._M_len = (size_t)&results;
        util::InternalError(str);
        util::Status::operator=(&(this->super_ModelInterface).status_,(Status *)&results);
        util::Status::~Status((Status *)&results);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&value.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                (&key.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    }
  }
  return;
}

Assistant:

void Model::BuildTrie(std::vector<std::pair<absl::string_view, int>> *pieces) {
  if (!status().ok()) return;

  if (pieces->empty()) {
    status_ = util::InternalError("no pieces are loaded.");
    return;
  }

  // sort by sentencepiece since DoubleArray::build()
  // only accepts sorted strings.
  sort(pieces->begin(), pieces->end());

  // Makes key/value set for DoubleArrayTrie.
  std::vector<const char *> key(pieces->size());
  std::vector<int> value(pieces->size());
  for (size_t i = 0; i < pieces->size(); ++i) {
    key[i] = (*pieces)[i].first.data();  // sorted piece.
    value[i] = (*pieces)[i].second;      // vocab_id
  }

  trie_ = std::make_unique<Darts::DoubleArray>();
  if (trie_->build(key.size(), const_cast<char **>(&key[0]), nullptr,
                   &value[0]) != 0) {
    status_ = util::InternalError("cannot build double-array.");
    return;
  }

  // Computes the maximum number of shared prefixes in the trie.
  const int kMaxTrieResultsSize = 1024;
  std::vector<Darts::DoubleArray::result_pair_type> results(
      kMaxTrieResultsSize);
  trie_results_size_ = 0;
  for (const auto &p : *pieces) {
    const int num_nodes = trie_->commonPrefixSearch(
        p.first.data(), results.data(), results.size(), p.first.size());
    trie_results_size_ = std::max(trie_results_size_, num_nodes);
  }

  pieces_.clear();

  if (trie_results_size_ == 0)
    status_ = util::InternalError("no entry is found in the trie.");
}